

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::Array<asl::Var>_> * __thiscall
asl::Array<asl::Array<asl::Var>_>::insert
          (Array<asl::Array<asl::Var>_> *this,int k,Array<asl::Var> *x)

{
  anon_union_8_8_7df20137_for_Var_3 *paVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  Var *pVVar5;
  Array<asl::Var> *pAVar6;
  undefined8 *puVar7;
  int iVar8;
  int iVar9;
  
  pAVar6 = this->_a;
  iVar2 = *(int *)&pAVar6[-2]._a;
  iVar3 = *(int *)((long)&pAVar6[-2]._a + 4);
  iVar8 = k;
  if (k < 0) {
    iVar8 = iVar2;
  }
  if (iVar2 < iVar3) {
    pAVar6 = pAVar6 + -2;
LAB_0013d830:
    if (iVar2 - iVar8 != 0 && iVar8 <= iVar2) {
      memmove(this->_a + (long)iVar8 + 1,this->_a + iVar8,(long)(iVar2 - iVar8) << 3);
    }
    pVVar5 = x->_a;
    this->_a[iVar8]._a = pVVar5;
    LOCK();
    paVar1 = &pVVar5[-1].field_1;
    paVar1->_i = paVar1->_i + 1;
    UNLOCK();
    *(int *)&pAVar6->_a = iVar2 + 1;
    return this;
  }
  if (iVar2 != 0x7fffffff) {
    dup(this,k);
    uVar4 = *(undefined4 *)&this->_a[-1]._a;
    iVar9 = 0x7fffffff;
    if (iVar3 < 0x3ffffffe) {
      iVar9 = iVar3 * 2 + 2;
    }
    pAVar6 = (Array<asl::Var> *)realloc(this->_a + -2,(long)iVar9 * 8 + 0x10);
    if (pAVar6 != (Array<asl::Var> *)0x0) {
      this->_a = pAVar6 + 2;
      *(int *)((long)&pAVar6->_a + 4) = iVar9;
      *(undefined4 *)&pAVar6[1]._a = uVar4;
      goto LAB_0013d830;
    }
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = dup2;
  __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}